

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void regress(FILE *in)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  size_t sVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  char *f [10];
  char erbuf [100];
  regex_t re;
  char inbuf [1000];
  char *local_4f8 [10];
  char local_4a8;
  char cStack_4a7;
  char cStack_4a6;
  char cStack_4a5;
  char cStack_4a4;
  char cStack_4a3;
  char cStack_4a2;
  char cStack_4a1;
  char cStack_4a0;
  char cStack_49f;
  char cStack_49e;
  char cStack_49d;
  char cStack_49c;
  char cStack_49b;
  char cStack_49a;
  char cStack_499;
  char cStack_498;
  char cStack_497;
  char cStack_496;
  char cStack_495;
  char cStack_494;
  char cStack_493;
  char cStack_492;
  char cStack_491;
  char cStack_490;
  char cStack_48f;
  char cStack_48e;
  regex_t local_438 [16];
  char **__s;
  
  do {
    do {
      __s = &local_438[0].fastmap;
      pcVar6 = fgets((char *)__s,1000,(FILE *)in);
      if (pcVar6 == (char *)0x0) {
        sVar7 = regerror(2,(regex_t *)0x0,&local_4a8,100);
        auVar14[0] = -(cStack_49d == 'u');
        auVar14[1] = -(cStack_49c == 'l');
        auVar14[2] = -(cStack_49b == 'a');
        auVar14[3] = -(cStack_49a == 'r');
        auVar14[4] = -(cStack_499 == ' ');
        auVar14[5] = -(cStack_498 == 'e');
        auVar14[6] = -(cStack_497 == 'x');
        auVar14[7] = -(cStack_496 == 'p');
        auVar14[8] = -(cStack_495 == 'r');
        auVar14[9] = -(cStack_494 == 'e');
        auVar14[10] = -(cStack_493 == 's');
        auVar14[0xb] = -(cStack_492 == 's');
        auVar14[0xc] = -(cStack_491 == 'i');
        auVar14[0xd] = -(cStack_490 == 'o');
        auVar14[0xe] = -(cStack_48f == 'n');
        auVar14[0xf] = -(cStack_48e == '\0');
        auVar13[0] = -(local_4a8 == 'i');
        auVar13[1] = -(cStack_4a7 == 'n');
        auVar13[2] = -(cStack_4a6 == 'v');
        auVar13[3] = -(cStack_4a5 == 'a');
        auVar13[4] = -(cStack_4a4 == 'l');
        auVar13[5] = -(cStack_4a3 == 'i');
        auVar13[6] = -(cStack_4a2 == 'd');
        auVar13[7] = -(cStack_4a1 == ' ');
        auVar13[8] = -(cStack_4a0 == 'r');
        auVar13[9] = -(cStack_49f == 'e');
        auVar13[10] = -(cStack_49e == 'g');
        auVar13[0xb] = -(cStack_49d == 'u');
        auVar13[0xc] = -(cStack_49c == 'l');
        auVar13[0xd] = -(cStack_49b == 'a');
        auVar13[0xe] = -(cStack_49a == 'r');
        auVar13[0xf] = -(cStack_499 == ' ');
        auVar13 = auVar13 & auVar14;
        if (((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) != 0xffff) || (sVar7 != 0x1b)) {
          regress_cold_2();
        }
        sVar7 = regerror(2,(regex_t *)0x0,&local_4a8,10);
        if (((cStack_4a0 != 'r' ||
              CONCAT17(cStack_4a1,
                       CONCAT16(cStack_4a2,
                                CONCAT15(cStack_4a3,
                                         CONCAT14(cStack_4a4,
                                                  CONCAT13(cStack_4a5,
                                                           CONCAT12(cStack_4a6,
                                                                    CONCAT11(cStack_4a7,local_4a8)))
                                                 )))) != 0x2064696c61766e69) || (cStack_49f != '\0')
            ) || (sVar7 != 0x1b)) {
          regress_cold_3();
        }
        sVar7 = regerror(0x102,(regex_t *)0x0,&local_4a8,100);
        if ((CONCAT17(cStack_49e,
                      CONCAT16(cStack_49f,
                               CONCAT15(cStack_4a0,
                                        CONCAT14(cStack_4a1,
                                                 CONCAT13(cStack_4a2,
                                                          CONCAT12(cStack_4a3,
                                                                   CONCAT11(cStack_4a4,cStack_4a5)))
                                                )))) != 0x5441504441425f ||
             CONCAT17(cStack_4a1,
                      CONCAT16(cStack_4a2,
                               CONCAT15(cStack_4a3,
                                        CONCAT14(cStack_4a4,
                                                 CONCAT13(cStack_4a5,
                                                          CONCAT12(cStack_4a6,
                                                                   CONCAT11(cStack_4a7,local_4a8))))
                                       ))) != 0x504441425f474552) || (sVar7 != 0xb)) {
          regress_cold_4();
        }
        local_438[0].used = 0x10c8c5;
        sVar7 = regerror(0xff,local_438,&local_4a8,100);
        iVar5 = atoi(&local_4a8);
        if ((iVar5 != 2) || (sVar9 = strlen(&local_4a8), sVar7 != sVar9 + 1)) {
          regress_cold_5();
        }
        return;
      }
      uVar11 = line + 1;
      line = uVar11;
    } while (((char)local_438[0].fastmap == '\n') || ((char)local_438[0].fastmap == '#'));
    sVar7 = strlen((char *)__s);
    *(undefined1 *)((long)__s + (sVar7 - 1)) = 0;
    if (debug != 0) {
      fprintf(_stdout,"%d:\n",(ulong)uVar11);
    }
    uVar11 = split((char *)__s,local_4f8,10,"\t\t");
    uVar12 = (uint)__s;
    if ((int)uVar11 < 3) {
      regress_cold_1();
      sVar7 = regerror(uVar12 | 0x100,(regex_t *)0x0,eprint::epbuf,100);
      if (100 < sVar7) {
        __assert_fail("len <= sizeof(epbuf)",
                      "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/main.c"
                      ,0x20d,"char *eprint()");
      }
      return;
    }
    uVar10 = 0;
    do {
      pcVar6 = local_4f8[uVar10];
      if (((*pcVar6 == '\"') && (pcVar6[1] == '\"')) && (pcVar6[2] == '\0')) {
        local_4f8[uVar10] = "";
      }
      pcVar2 = local_4f8[2];
      pcVar1 = local_4f8[1];
      pcVar6 = local_4f8[0];
      uVar10 = uVar10 + 1;
    } while (uVar11 != uVar10);
    if (uVar11 == 3) {
      local_4f8[3] = (char *)0x0;
LAB_0010ad50:
      local_4f8[4] = (char *)0x0;
    }
    else if ((int)uVar11 < 5) goto LAB_0010ad50;
    pcVar4 = local_4f8[4];
    pcVar3 = local_4f8[3];
    iVar5 = options(99,local_4f8[1]);
    try(pcVar6,pcVar1,pcVar2,pcVar3,pcVar4,iVar5);
    pcVar1 = local_4f8[1];
    pcVar8 = strchr(local_4f8[1],0x26);
    pcVar4 = local_4f8[4];
    pcVar3 = local_4f8[3];
    pcVar2 = local_4f8[2];
    pcVar6 = local_4f8[0];
    if (pcVar8 != (char *)0x0) {
      uVar11 = options(99,pcVar1);
      try(pcVar6,pcVar1,pcVar2,pcVar3,pcVar4,uVar11 & 0xfffffffe);
    }
  } while( true );
}

Assistant:

static void
regress(in)
FILE *in;
{
	char inbuf[1000];
#	define	MAXF	10
	char *f[MAXF];
	int nf;
	int i;
	char erbuf[100];
	size_t ne;
	char *badpat = "invalid regular expression";
#	define	SHORT	10
	char *bpname = "REG_BADPAT";
	regex_t re;

	while (fgets(inbuf, sizeof(inbuf), in) != NULL) {
		line++;
		if (inbuf[0] == '#' || inbuf[0] == '\n')
			continue;			/* NOTE CONTINUE */
		inbuf[strlen(inbuf)-1] = '\0';	/* get rid of stupid \n */
		if (debug)
			fprintf(stdout, "%d:\n", line);
		nf = split(inbuf, f, MAXF, "\t\t");
		if (nf < 3) {
			fprintf(stderr, "bad input, line %d\n", line);
			exit(1);
		}
		for (i = 0; i < nf; i++)
			if (strcmp(f[i], "\"\"") == 0)
				f[i] = "";
		if (nf <= 3)
			f[3] = NULL;
		if (nf <= 4)
			f[4] = NULL;
		try(f[0], f[1], f[2], f[3], f[4], options('c', f[1]));
		if (opt('&', f[1]))	/* try with either type of RE */
			try(f[0], f[1], f[2], f[3], f[4],
					options('c', f[1]) &~ REG_EXTENDED);
	}

	ne = regerror(REG_BADPAT, (regex_t *)NULL, erbuf, sizeof(erbuf));
	if (strcmp(erbuf, badpat) != 0 || ne != strlen(badpat)+1) {
		fprintf(stderr, "end: regerror() test gave `%s' not `%s'\n",
							erbuf, badpat);
		status = 1;
	}
	ne = regerror(REG_BADPAT, (regex_t *)NULL, erbuf, (size_t)SHORT);
	if (strncmp(erbuf, badpat, SHORT-1) != 0 || erbuf[SHORT-1] != '\0' ||
						ne != strlen(badpat)+1) {
		fprintf(stderr, "end: regerror() short test gave `%s' not `%.*s'\n",
						erbuf, SHORT-1, badpat);
		status = 1;
	}
	ne = regerror(REG_ITOA|REG_BADPAT, (regex_t *)NULL, erbuf, sizeof(erbuf));
	if (strcmp(erbuf, bpname) != 0 || ne != strlen(bpname)+1) {
		fprintf(stderr, "end: regerror() ITOA test gave `%s' not `%s'\n",
						erbuf, bpname);
		status = 1;
	}
	re.re_endp = bpname;
	ne = regerror(REG_ATOI, &re, erbuf, sizeof(erbuf));
	if (atoi(erbuf) != (int)REG_BADPAT) {
		fprintf(stderr, "end: regerror() ATOI test gave `%s' not `%ld'\n",
						erbuf, (long)REG_BADPAT);
		status = 1;
	} else if (ne != strlen(erbuf)+1) {
		fprintf(stderr, "end: regerror() ATOI test len(`%s') = %ld\n",
						erbuf, (long)REG_BADPAT);
		status = 1;
	}
}